

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

Point __thiscall Point::randomPoint(Point *this,int max_x,int max_y)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int y;
  int x;
  double u2;
  double u1;
  double s;
  double v2;
  double v1;
  int max_y_local;
  int max_x_local;
  
  iVar1 = rand();
  dVar2 = ((double)(iVar1 % 1000000) * 2.0) / 1000000.0 - 1.0;
  iVar1 = rand();
  dVar3 = ((double)(iVar1 % 1000000) * 2.0) / 1000000.0 - 1.0;
  dVar4 = sqrt(dVar2 * dVar2 + dVar3 * dVar3);
  if (dVar4 <= 1.0) {
    dVar5 = log(dVar4);
    dVar5 = sqrt((dVar5 * -2.0) / dVar4);
    dVar6 = log(dVar4);
    dVar4 = sqrt((dVar6 * -2.0) / dVar4);
    dVar2 = ceil((double)max_x * dVar2 * dVar5);
    dVar3 = ceil((double)max_y * dVar3 * dVar4);
    Point(this,(int)dVar2,(int)dVar3);
  }
  else {
    randomPoint(this,max_x,max_y);
  }
  return (Point)this;
}

Assistant:

Point Point::randomPoint(int max_x, int max_y){
	double v1 = 2*((double)(rand()%MAAAX))/MAAAX - 1;
	double v2 = 2*((double)(rand()%MAAAX))/	MAAAX - 1;
	double s = sqrt(v1*v1 + v2*v2);
	if (s > 1){
		return randomPoint(max_x, max_y);
	}
	double u1 = v1*sqrt(-2*log(s)/s);
	double u2 = v2*sqrt(-2*log(s)/s);
	u1 = u1;
	u2 = u2;
	int x = ceil(max_x*u1);
	int y = ceil(max_y*u2);
	return Point(x, y);
}